

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O0

bool __thiscall FIX::FieldMap::getFieldIfSet(FieldMap *this,FieldBase *field)

{
  bool bVar1;
  int tag;
  reference rhs;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_30;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_28;
  const_iterator iter;
  FieldBase *field_local;
  FieldMap *this_local;
  
  iter._M_current = field;
  tag = FieldBase::getTag(field);
  local_28._M_current = (FieldBase *)findTag(this,tag);
  local_30._M_current =
       (FieldBase *)
       std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::end
                 ((vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_> *)(this + 8));
  bVar1 = __gnu_cxx::operator==(&local_28,&local_30);
  if (!bVar1) {
    rhs = __gnu_cxx::
          __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
          ::operator*(&local_28);
    FieldBase::operator=(iter._M_current,rhs);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool getFieldIfSet( FieldBase& field ) const
  {
    Fields::const_iterator iter = findTag( field.getTag() );
    if ( iter == m_fields.end() )
      return false;
    field = (*iter);
    return true;
  }